

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum.cpp
# Opt level: O1

AggregateFunction *
duckdb::GetSumAggregate(AggregateFunction *__return_storage_ptr__,PhysicalType type)

{
  int iVar1;
  InternalException *this;
  undefined7 in_register_00000031;
  LogicalType *pLVar2;
  FunctionNullHandling in_R8B;
  undefined1 local_b8 [56];
  LogicalType local_80;
  LogicalType local_68;
  LogicalType local_50;
  LogicalType local_38;
  
  iVar1 = (int)CONCAT71(in_register_00000031,type);
  switch(iVar1) {
  case 1:
    LogicalType::LogicalType((LogicalType *)local_b8,BOOLEAN);
    LogicalType::LogicalType(&local_38,HUGEINT);
    AggregateFunction::
    UnaryAggregate<duckdb::SumState<long>,bool,duckdb::hugeint_t,duckdb::IntegerSumOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,(AggregateFunction *)local_b8,&local_38,(LogicalType *)0x0,
               in_R8B);
    pLVar2 = &local_38;
    break;
  case 2:
  case 3:
  case 4:
  case 6:
  case 8:
switchD_00d3827d_caseD_2:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_b8._0_8_ = local_b8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,"Unimplemented sum aggregate","");
    InternalException::InternalException(this,(string *)local_b8);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 5:
    LogicalType::LogicalType((LogicalType *)local_b8,SMALLINT);
    LogicalType::LogicalType(&local_50,HUGEINT);
    AggregateFunction::
    UnaryAggregate<duckdb::SumState<long>,short,duckdb::hugeint_t,duckdb::IntegerSumOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,(AggregateFunction *)local_b8,&local_50,(LogicalType *)0x0,
               in_R8B);
    pLVar2 = &local_50;
    break;
  case 7:
    LogicalType::LogicalType((LogicalType *)local_b8,INTEGER);
    LogicalType::LogicalType(&local_68,HUGEINT);
    AggregateFunction::
    UnaryAggregate<duckdb::SumState<duckdb::hugeint_t>,int,duckdb::hugeint_t,duckdb::SumToHugeintOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,(AggregateFunction *)local_b8,&local_68,(LogicalType *)0x0,
               in_R8B);
    pLVar2 = &local_68;
    goto LAB_00d3836c;
  case 9:
    LogicalType::LogicalType((LogicalType *)local_b8,BIGINT);
    LogicalType::LogicalType(&local_80,HUGEINT);
    AggregateFunction::
    UnaryAggregate<duckdb::SumState<duckdb::hugeint_t>,long,duckdb::hugeint_t,duckdb::SumToHugeintOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,(AggregateFunction *)local_b8,&local_80,(LogicalType *)0x0,
               in_R8B);
    pLVar2 = &local_80;
LAB_00d3836c:
    LogicalType::~LogicalType(pLVar2);
    LogicalType::~LogicalType((LogicalType *)local_b8);
    __return_storage_ptr__->statistics = SumPropagateStats;
    goto LAB_00d383c9;
  default:
    if (iVar1 != 0xcc) goto switchD_00d3827d_caseD_2;
    LogicalType::LogicalType((LogicalType *)local_b8,HUGEINT);
    LogicalType::LogicalType((LogicalType *)(local_b8 + 0x20),HUGEINT);
    AggregateFunction::
    UnaryAggregate<duckdb::SumState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::HugeintSumOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,(AggregateFunction *)local_b8,(LogicalType *)(local_b8 + 0x20)
               ,(LogicalType *)0x0,in_R8B);
    pLVar2 = (LogicalType *)(local_b8 + 0x20);
  }
  LogicalType::~LogicalType(pLVar2);
  LogicalType::~LogicalType((LogicalType *)local_b8);
LAB_00d383c9:
  __return_storage_ptr__->order_dependent = NOT_ORDER_DEPENDENT;
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetSumAggregate(PhysicalType type) {
	switch (type) {
	case PhysicalType::BOOL: {
		auto function = AggregateFunction::UnaryAggregate<SumState<int64_t>, bool, hugeint_t, IntegerSumOperation>(
		    LogicalType::BOOLEAN, LogicalType::HUGEINT);
		function.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
		return function;
	}
	case PhysicalType::INT16: {
		auto function = AggregateFunction::UnaryAggregate<SumState<int64_t>, int16_t, hugeint_t, IntegerSumOperation>(
		    LogicalType::SMALLINT, LogicalType::HUGEINT);
		function.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
		return function;
	}

	case PhysicalType::INT32: {
		auto function =
		    AggregateFunction::UnaryAggregate<SumState<hugeint_t>, int32_t, hugeint_t, SumToHugeintOperation>(
		        LogicalType::INTEGER, LogicalType::HUGEINT);
		function.statistics = SumPropagateStats;
		function.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
		return function;
	}
	case PhysicalType::INT64: {
		auto function =
		    AggregateFunction::UnaryAggregate<SumState<hugeint_t>, int64_t, hugeint_t, SumToHugeintOperation>(
		        LogicalType::BIGINT, LogicalType::HUGEINT);
		function.statistics = SumPropagateStats;
		function.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
		return function;
	}
	case PhysicalType::INT128: {
		auto function =
		    AggregateFunction::UnaryAggregate<SumState<hugeint_t>, hugeint_t, hugeint_t, HugeintSumOperation>(
		        LogicalType::HUGEINT, LogicalType::HUGEINT);
		function.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
		return function;
	}
	default:
		throw InternalException("Unimplemented sum aggregate");
	}
}